

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_xml.cpp
# Opt level: O0

XMLElement * __thiscall Kumu::XMLElement::AddChild(XMLElement *this,XMLElement *element)

{
  XMLElement *local_18;
  XMLElement *element_local;
  XMLElement *this_local;
  
  local_18 = element;
  element_local = this;
  std::__cxx11::list<Kumu::XMLElement_*,_std::allocator<Kumu::XMLElement_*>_>::push_back
            (&this->m_ChildList,&local_18);
  return local_18;
}

Assistant:

Kumu::XMLElement*
Kumu::XMLElement::AddChild(Kumu::XMLElement* element)
{
  m_ChildList.push_back(element); // takes posession!
  return element;
}